

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O0

void __thiscall Liby::PollerEpoll::addChanel(PollerEpoll *this,Channel *ch)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  Logger *this_00;
  bool bVar5;
  double __x;
  int local_30;
  int local_2c;
  int it;
  int ret;
  epoll_event event;
  int fd;
  Channel *ch_local;
  PollerEpoll *this_local;
  
  bVar5 = false;
  unique0x1000019b = ch;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar5 = -1 < iVar1;
  }
  if (!bVar5) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp"
                  ,0x3c,"virtual void Liby::PollerEpoll::addChanel(Channel *)");
  }
  ret = Channel::get_fd(stack0xffffffffffffffe8);
  it = 0x2010;
  event.data.fd = ret;
  bVar5 = Channel::readable(stack0xffffffffffffffe8);
  if (bVar5) {
    it = it | 1;
  }
  bVar5 = Channel::writable(stack0xffffffffffffffe8);
  if (bVar5) {
    it = it | 4;
  }
  local_2c = epoll_ctl(this->pollerfd_,1,event.data.fd,(epoll_event *)&it);
  if (-1 < local_2c) {
    Poller::setChannel(&this->super_Poller,event.data.fd,stack0xffffffffffffffe8);
    this->eventsSize_ = this->eventsSize_ + 1;
    this_00 = Logger::getLogger();
    Channel::get_fd(stack0xffffffffffffffe8);
    Logger::log(this_00,__x);
    return;
  }
  piVar2 = __errno_location();
  local_30 = *piVar2;
  ClearUnuseVariableWarning<int&>(&local_30);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  piVar2 = __errno_location();
  pcVar4 = strerror(*piVar2);
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char*::typeinfo,0);
}

Assistant:

void PollerEpoll::addChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    struct epoll_event event;
    event.data.fd = fd;
    event.events = EPOLLHUP | EPOLLRDHUP;

    if (ch->readable()) {
        event.events |= EPOLLIN;
    }

    if (ch->writable()) {
        event.events |= EPOLLOUT;
    }

    int ret = ::epoll_ctl(pollerfd_, EPOLL_CTL_ADD, fd, &event);

    if (ret < 0) {
        auto it = errno;
        ClearUnuseVariableWarning(it);
        throw ::strerror(errno);
    } else {
        setChannel(fd, ch);
        eventsSize_++;
    }

    verbose("add channel fd = %d", ch->get_fd());
}